

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O1

void __thiscall
LockedPoolManager::LockedPoolManager
          (LockedPoolManager *this,
          unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> allocator_in)

{
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *plVar1;
  long lVar2;
  _Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_> _Var3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3.super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl =
       *(_Head_base<0UL,_LockedPageAllocator_*,_false> *)
        allocator_in._M_t.
        super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
        super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
        super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
  *(undefined8 *)
   allocator_in._M_t.
   super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
   super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
   super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl = 0;
  (this->super_LockedPool).allocator._M_t.
  super___uniq_ptr_impl<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>._M_t.
  super__Tuple_impl<0UL,_LockedPageAllocator_*,_std::default_delete<LockedPageAllocator>_>.
  super__Head_base<0UL,_LockedPageAllocator_*,_false> =
       _Var3.super__Head_base<0UL,_LockedPageAllocator_*,_false>._M_head_impl;
  plVar1 = &(this->super_LockedPool).arenas;
  (this->super_LockedPool).arenas.
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_LockedPool).arenas.
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_LockedPool).arenas.
  super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>.
  _M_impl._M_node._M_size = 0;
  (this->super_LockedPool).lf_cb = LockingFailed;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    (this->super_LockedPool).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (this->super_LockedPool).mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)((long)&(this->super_LockedPool).mutex.super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(this->super_LockedPool).mutex.super___mutex_base._M_mutex + 0x10) = 0;
    (this->super_LockedPool).cumulative_bytes_locked = 0;
    (this->super_LockedPool).mutex.super___mutex_base._M_mutex.__align = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

LockedPoolManager::LockedPoolManager(std::unique_ptr<LockedPageAllocator> allocator_in):
    LockedPool(std::move(allocator_in), &LockedPoolManager::LockingFailed)
{
}